

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::push_back
          (array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute> *this,
          SAttribute *element)

{
  uint uVar1;
  uint uVar2;
  SAttribute e;
  SAttribute SStack_38;
  
  uVar1 = this->used;
  uVar2 = uVar1 + 1;
  if (this->allocated < uVar2) {
    io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute::SAttribute(&SStack_38);
    io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute::operator=(&SStack_38,element);
    reallocate(this,this->used * 2 + 1);
    uVar1 = this->used;
    this->used = uVar1 + 1;
    io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute::operator=
              (this->data + uVar1,&SStack_38);
    this->is_sorted = false;
    io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute::~SAttribute(&SStack_38);
  }
  else {
    this->used = uVar2;
    io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute::operator=
              (this->data + uVar1,element);
    this->is_sorted = false;
  }
  return;
}

Assistant:

void push_back(const T& element)
	{
		if (used + 1 > allocated)
		{
			// reallocate(used * 2 +1);
			// this doesn't work if the element is in the same array. So
			// we'll copy the element first to be sure we'll get no data
			// corruption

			T e;
			e = element;           // copy element
			reallocate(used * 2 +1); // increase data block
			data[used++] = e;        // push_back
			is_sorted = false; 
			return;
		}

		data[used++] = element;
		is_sorted = false;
	}